

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

int64 google::protobuf::util::TimeUtil::TimestampToMicroseconds(Timestamp *timestamp)

{
  int iVar1;
  
  iVar1 = timestamp->nanos_;
  return (ulong)(0 < iVar1 % 1000 && iVar1 < -999) + timestamp->seconds_ * 1000000 +
         (long)(iVar1 / 1000);
}

Assistant:

int64 TimeUtil::TimestampToMicroseconds(const Timestamp& timestamp) {
  return timestamp.seconds() * kMicrosPerSecond +
         RoundTowardZero(timestamp.nanos(), kNanosPerMicrosecond);
}